

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReOrderJointTypes
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *origJTIndexMapping,
          vector<double,_std::allocator<double>_> *origValues,
          vector<double,_std::allocator<double>_> *orderedValues,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jtIndexMapping)

{
  double dVar1;
  value_type vVar2;
  char *arg;
  char *pcVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  undefined8 uVar5;
  allocator_type *__a;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R8;
  Index jt_oI;
  double origValue;
  Index jt_bgI;
  size_t nrJTypes;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar9;
  uint local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_59;
  allocator_type *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  arg = (char *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  pcVar3 = (char *)std::vector<double,_std::allocator<double>_>::size(local_18);
  if (arg == pcVar3) {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::vector<double,_std::allocator<double>_>::size(local_18);
    pvVar4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<double,_std::allocator<double>_>::size(local_20);
    if (this_00 == pvVar4) {
      __a = (allocator_type *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_10);
      pvVar4 = &local_59;
      local_40 = __a;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x16194a);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (this_00,in_stack_ffffffffffffff78,(value_type_conflict2 *)pvVar4,__a);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (pvVar4,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(pvVar4);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x16198d);
      local_60 = 0;
      do {
        if ((allocator_type *)(ulong)local_60 == local_40) {
          return;
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(ulong)local_60);
        dVar1 = *pvVar6;
        for (uVar9 = 0; (allocator_type *)(ulong)uVar9 != local_40; uVar9 = uVar9 + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(ulong)uVar9);
          if ((*pvVar6 == dVar1) && (!NAN(*pvVar6) && !NAN(dVar1))) {
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (local_28,(ulong)uVar9);
            if (*pvVar7 == 0xffffffff) {
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (local_10,(ulong)local_60);
              vVar2 = *pvVar8;
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (local_28,(ulong)uVar9);
              *pvVar7 = vVar2;
              break;
            }
          }
        }
        local_60 = local_60 + 1;
      } while( true );
    }
  }
  uVar5 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),arg);
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

void ReOrderJointTypes(
            const std::vector<Index> &origJTIndexMapping,
            const std::vector<double> &origValues,
            const std::vector<double> &orderedValues,
            std::vector<Index>& jtIndexMapping ) const{
    if((origJTIndexMapping.size() != origValues.size()) ||
       (origValues.size()!=orderedValues.size()))
        throw(E("BGIP_SolverBranchAndBound::ReOrderJointTypes() std::vectors should all have the same length"));

    size_t nrJTypes=origJTIndexMapping.size();
    jtIndexMapping = std::vector<Index>(nrJTypes, UNSPECIFIED_ACTION);

    //we search where jt_bgI ended up
    for(Index jt_bgI=0;jt_bgI!=nrJTypes;++jt_bgI)
    {
        //the original value of the jt_bgI-th joint type (of the BG)
        double origValue=origValues[jt_bgI];
        for(Index jt_oI=0;jt_oI!=nrJTypes;++jt_oI)
        {
            if(orderedValues[jt_oI]==origValue &&
               //make sure that jt_oI is not specified yet (in
               //case of equal vals)
               jtIndexMapping[jt_oI]==UNSPECIFIED_ACTION)
            {
                jtIndexMapping[jt_oI]=origJTIndexMapping[jt_bgI];
                break;
            }
        }
    }
}